

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_archive.cpp
# Opt level: O0

void __thiscall
boost::archive::json_archive::push_obj_repository
          (json_archive *this,uint32_t class_id,uint32_t obj_id)

{
  size_type sVar1;
  char *pcVar2;
  __cxx11 local_70 [48];
  __cxx11 local_40 [36];
  value_type local_1c;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t obj_id_local;
  uint32_t class_id_local;
  json_archive *this_local;
  
  local_18 = obj_id;
  local_14 = class_id;
  _obj_id_local = this;
  sVar1 = std::
          vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
          ::size(&this->data_stack_);
  local_1c = (value_type)sVar1;
  std::vector<int,_std::allocator<int>_>::push_back(&this->data_mark_,&local_1c);
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  ::push_back(&this->data_stack_,&this->obj_repository_);
  std::__cxx11::to_string(local_40,local_14);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  push_data(this,pcVar2);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::to_string(local_70,local_18);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  push_data(this,pcVar2);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void json_archive::push_obj_repository(const uint32_t class_id, const uint32_t obj_id)
{
    data_mark_.push_back(data_stack_.size());
    data_stack_.push_back(obj_repository_);

    push_data(std::to_string(class_id).c_str());
    push_data(std::to_string(obj_id).c_str());
}